

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O0

int htmlSaveFileFormat(char *filename,xmlDocPtr cur,char *encoding,int format)

{
  xmlCharEncoding xVar1;
  xmlOutputBufferPtr buf_00;
  xmlCharEncoding enc;
  int ret;
  xmlCharEncodingHandlerPtr handler;
  xmlOutputBufferPtr buf;
  int format_local;
  char *encoding_local;
  xmlDocPtr cur_local;
  char *filename_local;
  
  _enc = (xmlCharEncodingHandlerPtr)0x0;
  if ((cur == (xmlDocPtr)0x0) || (filename == (char *)0x0)) {
    filename_local._4_4_ = -1;
  }
  else {
    xmlInitParser();
    if (encoding == (char *)0x0) {
      htmlSetMetaEncoding(cur,"UTF-8");
      _enc = xmlFindCharEncodingHandler("HTML");
      if (_enc == (xmlCharEncodingHandlerPtr)0x0) {
        _enc = xmlFindCharEncodingHandler("ascii");
      }
    }
    else {
      xVar1 = xmlParseCharEncoding(encoding);
      if ((xVar1 != XML_CHAR_ENCODING_UTF8) &&
         (_enc = xmlFindCharEncodingHandler(encoding), _enc == (xmlCharEncodingHandlerPtr)0x0)) {
        htmlSaveErr(0x57b,(xmlNodePtr)0x0,encoding);
      }
      htmlSetMetaEncoding(cur,(xmlChar *)encoding);
    }
    buf_00 = xmlOutputBufferCreateFilename(filename,_enc,0);
    if (buf_00 == (xmlOutputBufferPtr)0x0) {
      filename_local._4_4_ = 0;
    }
    else {
      htmlDocContentDumpFormatOutput(buf_00,cur,encoding,format);
      filename_local._4_4_ = xmlOutputBufferClose(buf_00);
    }
  }
  return filename_local._4_4_;
}

Assistant:

int
htmlSaveFileFormat(const char *filename, xmlDocPtr cur,
	           const char *encoding, int format) {
    xmlOutputBufferPtr buf;
    xmlCharEncodingHandlerPtr handler = NULL;
    int ret;

    if ((cur == NULL) || (filename == NULL))
        return(-1);

    xmlInitParser();

    if (encoding != NULL) {
	xmlCharEncoding enc;

	enc = xmlParseCharEncoding(encoding);
	if (enc != XML_CHAR_ENCODING_UTF8) {
	    handler = xmlFindCharEncodingHandler(encoding);
	    if (handler == NULL)
		htmlSaveErr(XML_SAVE_UNKNOWN_ENCODING, NULL, encoding);
	}
        htmlSetMetaEncoding(cur, (const xmlChar *) encoding);
    } else {
	htmlSetMetaEncoding(cur, (const xmlChar *) "UTF-8");

        /*
         * Fallback to HTML or ASCII when the encoding is unspecified
         */
        if (handler == NULL)
            handler = xmlFindCharEncodingHandler("HTML");
        if (handler == NULL)
            handler = xmlFindCharEncodingHandler("ascii");
    }

    /*
     * save the content to a temp buffer.
     */
    buf = xmlOutputBufferCreateFilename(filename, handler, 0);
    if (buf == NULL) return(0);

    htmlDocContentDumpFormatOutput(buf, cur, encoding, format);

    ret = xmlOutputBufferClose(buf);
    return(ret);
}